

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::SequenceMatchListSyntax::getChild
          (TokenOrSyntax *__return_storage_ptr__,SequenceMatchListSyntax *this,size_t index)

{
  Token token;
  SyntaxNode *local_50;
  size_t index_local;
  SequenceMatchListSyntax *this_local;
  
  if (index == 0) {
    token.kind = (this->comma).kind;
    token._2_1_ = (this->comma).field_0x2;
    token.numFlags.raw = (this->comma).numFlags.raw;
    token.rawLen = (this->comma).rawLen;
    token.info = (this->comma).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token);
  }
  else if (index == 1) {
    local_50 = (SyntaxNode *)0x0;
    if (this != (SequenceMatchListSyntax *)0xffffffffffffffe0) {
      local_50 = &(this->items).super_SyntaxListBase.super_SyntaxNode;
    }
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,local_50);
  }
  else {
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

TokenOrSyntax SequenceMatchListSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return comma;
        case 1: return &items;
        default: return nullptr;
    }
}